

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
external_light_sensor_message_write_read::test_method
          (external_light_sensor_message_write_read *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  reference pvVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f8;
  undefined1 local_d1 [9];
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_c8;
  assertion_result local_b8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  buffer_reader reader;
  external_light_sensor_message read_msg;
  undefined1 local_48 [8];
  buffer_writer writer;
  buffer buffer;
  int i;
  external_light_sensor_message write_msg;
  external_light_sensor_message_write_read *this_local;
  
  write_msg.data._M_elems[0] = (array<double,_1UL>)(array<double,_1UL>)this;
  for (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 1;
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar2 = std::array<double,_1UL>::operator[]
                       ((array<double,_1UL> *)&stack0xffffffffffffffe8,
                        (long)buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar2 = (double)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 0.6;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  buffer_writer::buffer_writer((buffer_writer *)local_48,(buffer *)&writer._start);
  ::operator<<((buffer_writer *)local_48,(external_light_sensor_message *)&stack0xffffffffffffffe8);
  buffer_reader::buffer_reader((buffer_reader *)local_78,(buffer *)&writer._start);
  ::operator>>((buffer_reader *)local_78,(external_light_sensor_message *)((long)&reader._index + 4)
              );
  for (local_7c = 0; local_7c < 1; local_7c = local_7c + 1) {
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
      boost::unit_test::unit_test_log_t::set_checkpoint(this_00,&local_90,200,&local_a0);
      std::array<double,_1UL>::operator[]
                ((array<double,_1UL> *)((long)&reader._index + 4),(long)local_7c);
      boost::test_tools::assertion::seed::operator->*((seed *)(local_d1 + 1),(double *)local_d1);
      std::array<double,_1UL>::operator[]
                ((array<double,_1UL> *)&stack0xffffffffffffffe8,(long)local_7c);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<double&>,double>::operator==
                ((expression_base<boost::test_tools::assertion::value_expr<double&>,double> *)
                 &local_c8,(double *)(local_d1 + 1));
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
      ::evaluate(&local_b8,&local_c8,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_108,"read_msg.data[i] == write_msg.data[i]",0x25);
      boost::unit_test::operator<<(&local_f8,prev,&local_108);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_f8.super_lazy_ostream,&local_118,200,CHECK,CHECK_BUILT_ASSERTION,0
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_f8);
      boost::test_tools::assertion_result::~assertion_result(&local_b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_light_sensor_message_write_read)
{
    external_light_sensor_message write_msg;
    for(int i = 0; i<1; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.6;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_light_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<1; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}